

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

void __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<bool,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>::
ParallelFunctionAnalysis
          (ParallelFunctionAnalysis<bool,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> *this,
          Module *wasm,Func *work)

{
  bool bVar1;
  Func local_78;
  pointer local_48;
  reference local_40;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range3;
  Func *work_local;
  Module *wasm_local;
  ParallelFunctionAnalysis<bool,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> *this_local;
  
  this->wasm = wasm;
  std::
  map<wasm::Function_*,_bool,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>_>
  ::map((map<wasm::Function_*,_bool,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>_>
         *)&this->field_0x8);
  __end3 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin(&wasm->functions);
  func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end(&wasm->functions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                *)&func);
    if (!bVar1) break;
    local_40 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
               ::operator*(&__end3);
    local_48 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(local_40);
    std::
    map<wasm::Function_*,_bool,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>_>
    ::operator[]((map<wasm::Function_*,_bool,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>_>
                  *)&this->field_0x8,&local_48);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end3);
  }
  std::function<void_(wasm::Function_*,_bool_&)>::function
            ((function<void_(wasm::Function_*,_bool_&)> *)&local_78,
             (function<void_(wasm::Function_*,_bool_&)> *)work);
  doAnalysis(this,&local_78);
  std::function<void_(wasm::Function_*,_bool_&)>::~function
            ((function<void_(wasm::Function_*,_bool_&)> *)&local_78);
  return;
}

Assistant:

ParallelFunctionAnalysis(Module& wasm, Func work) : wasm(wasm) {
    // Fill in the map as we operate on it in parallel (each function to its own
    // entry).
    for (auto& func : wasm.functions) {
      map[func.get()];
    }

    doAnalysis(work);
  }